

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O2

ostream * __thiscall dg::debug::LLVMDG2Dot::printKey(LLVMDG2Dot *this,ostream *os,Value *val)

{
  Value VVar1;
  raw_ostream *prVar2;
  raw_os_ostream *this_00;
  ulong uVar3;
  char *pcVar4;
  StringRef SVar5;
  raw_os_ostream ro;
  string str;
  ostringstream ostr;
  
  if (val == (Value *)0x0) {
    std::operator<<(os,"(null)");
    return os;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  _ro = std::__throw_length_error;
  VVar1 = val[0x10];
  if (VVar1 == (Value)0x15) {
    SVar5 = (StringRef)llvm::Value::getName();
    prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&ro,SVar5);
    llvm::raw_ostream::operator<<(prVar2,"::\n");
    pcVar4 = "label ";
  }
  else {
    if (VVar1 != (Value)0x0) {
      if (0x1a < (byte)VVar1) {
        if (*(long *)(val + 0x28) == 0) {
          pcVar4 = "<null>::\n";
          this_00 = &ro;
        }
        else {
          SVar5 = (StringRef)llvm::Value::getName();
          this_00 = (raw_os_ostream *)llvm::raw_ostream::operator<<((raw_ostream *)&ro,SVar5);
          pcVar4 = "::\n";
        }
        llvm::raw_ostream::operator<<((raw_ostream *)this_00,pcVar4);
      }
      llvm::operator<<((raw_ostream *)&ro,val);
      goto LAB_00132a9a;
    }
    pcVar4 = "FUNC ";
  }
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)&ro,pcVar4);
  SVar5 = (StringRef)llvm::Value::getName();
  llvm::raw_ostream::operator<<(prVar2,SVar5);
LAB_00132a9a:
  llvm::raw_ostream::flush((raw_ostream *)&ro);
  std::__cxx11::stringbuf::str();
  if (100 < str._M_string_length) {
    std::__cxx11::string::resize((ulong)&str);
  }
  while (uVar3 = std::__cxx11::string::find((char)&str,0x22), uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)&str,uVar3,(char *)0x1);
  }
  std::operator<<(os,(string *)&str);
  std::__cxx11::string::_M_dispose();
  llvm::raw_os_ostream::~raw_os_ostream(&ro);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return os;
}

Assistant:

std::ostream &printKey(std::ostream &os, llvm::Value *val) override {
        return printLLVMVal(os, val);
    }